

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_storage.cpp
# Opt level: O2

void __thiscall
duckdb::LocalFileSecretStorage::LocalFileSecretStorage
          (LocalFileSecretStorage *this,SecretManager *manager,DatabaseInstance *db_p,string *name_p
          ,string *secret_path_p)

{
  string *__return_storage_ptr__;
  undefined8 __p;
  bool bVar1;
  Catalog *args;
  Catalog *args_00;
  __uniq_ptr_impl<duckdb::DefaultSecretGenerator,_std::default_delete<duckdb::DefaultSecretGenerator>_>
  local_60;
  LocalFileSystem fs;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  local_50;
  
  CatalogSetSecretStorage::CatalogSetSecretStorage
            (&this->super_CatalogSetSecretStorage,db_p,name_p,0x14);
  (this->super_CatalogSetSecretStorage).super_SecretStorage._vptr_SecretStorage =
       (_func_int **)&PTR__LocalFileSecretStorage_027baa78;
  (this->persistent_secrets)._M_h._M_buckets = &(this->persistent_secrets)._M_h._M_single_bucket;
  (this->persistent_secrets)._M_h._M_bucket_count = 1;
  (this->persistent_secrets)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->persistent_secrets)._M_h._M_element_count = 0;
  (this->persistent_secrets)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->persistent_secrets)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->persistent_secrets)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  __return_storage_ptr__ = &this->secret_path;
  FileSystem::ExpandPath
            ((string *)__return_storage_ptr__,(string *)secret_path_p,
             (optional_ptr<duckdb::FileOpener,_true>)0x0);
  (this->super_CatalogSetSecretStorage).super_SecretStorage.persistent = true;
  fs.super_FileSystem._vptr_FileSystem = (FileSystem)&PTR__FileSystem_027aca08;
  bVar1 = LocalFileSystem::DirectoryExists
                    (&fs,(string *)__return_storage_ptr__,
                     (optional_ptr<duckdb::FileOpener,_true>)0x0);
  if (bVar1) {
    local_50._M_invoker =
         ::std::
         _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/secret/secret_storage.cpp:142:29)>
         ::_M_invoke;
    local_50.super__Function_base._M_manager =
         ::std::
         _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/secret/secret_storage.cpp:142:29)>
         ::_M_manager;
    local_50.super__Function_base._M_functor._M_unused._M_object = (pointer)&fs;
    local_50.super__Function_base._M_functor._8_8_ = this;
    LocalFileSystem::ListFiles(&fs,(string *)__return_storage_ptr__,&local_50,(FileOpener *)0x0);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_50);
  }
  args = Catalog::GetSystemCatalog((this->super_CatalogSetSecretStorage).db);
  args_00 = Catalog::GetSystemCatalog((this->super_CatalogSetSecretStorage).db);
  make_uniq<duckdb::DefaultSecretGenerator,duckdb::Catalog&,duckdb::SecretManager&,std::unordered_set<std::__cxx11::string,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::__cxx11::string>>&>
            ((duckdb *)&local_60,args,manager,&this->persistent_secrets);
  make_uniq<duckdb::CatalogSet,duckdb::Catalog&,duckdb::unique_ptr<duckdb::DefaultSecretGenerator,std::default_delete<duckdb::DefaultSecretGenerator>,true>>
            ((duckdb *)&local_50,args_00,
             (unique_ptr<duckdb::DefaultSecretGenerator,_std::default_delete<duckdb::DefaultSecretGenerator>,_true>
              *)&local_60);
  __p = local_50.super__Function_base._M_functor._0_8_;
  local_50.super__Function_base._M_functor._0_8_ = 0;
  ::std::__uniq_ptr_impl<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>_>::reset
            ((__uniq_ptr_impl<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>_> *)
             &(this->super_CatalogSetSecretStorage).secrets,(pointer)__p);
  ::std::unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>_>::~unique_ptr
            ((unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>_> *)&local_50);
  if ((_Tuple_impl<0UL,_duckdb::DefaultSecretGenerator_*,_std::default_delete<duckdb::DefaultSecretGenerator>_>
       )local_60._M_t.
        super__Tuple_impl<0UL,_duckdb::DefaultSecretGenerator_*,_std::default_delete<duckdb::DefaultSecretGenerator>_>
        .super__Head_base<0UL,_duckdb::DefaultSecretGenerator_*,_false>._M_head_impl !=
      (DefaultSecretGenerator *)0x0) {
    (**(code **)(*(long *)local_60._M_t.
                          super__Tuple_impl<0UL,_duckdb::DefaultSecretGenerator_*,_std::default_delete<duckdb::DefaultSecretGenerator>_>
                          .super__Head_base<0UL,_duckdb::DefaultSecretGenerator_*,_false>.
                          _M_head_impl + 8))();
  }
  FileSystem::~FileSystem(&fs.super_FileSystem);
  return;
}

Assistant:

LocalFileSecretStorage::LocalFileSecretStorage(SecretManager &manager, DatabaseInstance &db_p, const string &name_p,
                                               const string &secret_path_p)
    : CatalogSetSecretStorage(db_p, name_p, LOCAL_FILE_STORAGE_OFFSET),
      secret_path(FileSystem::ExpandPath(secret_path_p, nullptr)) {
	persistent = true;

	// Check existence of persistent secret dir
	LocalFileSystem fs;
	if (fs.DirectoryExists(secret_path)) {
		fs.ListFiles(secret_path, [&](const string &fname, bool is_dir) {
			string full_path = fs.JoinPath(secret_path, fname);

			if (StringUtil::EndsWith(full_path, ".duckdb_secret")) {
				string secret_name = fname.substr(0, fname.size() - 14); // size of file ext
				persistent_secrets.insert(secret_name);
			}
		});
	}

	auto &catalog = Catalog::GetSystemCatalog(db);
	secrets = make_uniq<CatalogSet>(Catalog::GetSystemCatalog(db),
	                                make_uniq<DefaultSecretGenerator>(catalog, manager, persistent_secrets));
}